

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

IffEventClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IffEventClauseSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  IffEventClauseSyntax *pIVar6;
  
  pIVar6 = (IffEventClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((IffEventClauseSyntax *)this->endPtr < pIVar6 + 1) {
    pIVar6 = (IffEventClauseSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pIVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pIVar6->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pIVar6->super_SyntaxNode).kind = IffEventClause;
  (pIVar6->iff).kind = TVar2;
  (pIVar6->iff).field_0x2 = uVar3;
  (pIVar6->iff).numFlags = (NumericTokenFlags)NVar4.raw;
  (pIVar6->iff).rawLen = uVar5;
  (pIVar6->iff).info = pIVar1;
  (pIVar6->expr).ptr = args_1;
  (args_1->super_SyntaxNode).parent = &pIVar6->super_SyntaxNode;
  return pIVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }